

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_init_resampler(ebur128_state *st)

{
  ebur128_state_internal *peVar1;
  uint taps;
  interpolator *interp;
  float *__ptr;
  float *pfVar2;
  uint in_EDX;
  size_t sVar3;
  uint uVar4;
  
  if (st->samplerate < 96000) {
    uVar4 = st->channels;
    taps = 4;
  }
  else {
    if (0x2edff < st->samplerate) {
      peVar1 = st->d;
      peVar1->resampler_buffer_output = (float *)0x0;
      peVar1->interp = (interpolator *)0x0;
      peVar1->resampler_buffer_input = (float *)0x0;
      return 0;
    }
    uVar4 = st->channels;
    taps = 2;
  }
  interp = interp_create(taps,uVar4,in_EDX);
  peVar1 = st->d;
  peVar1->interp = interp;
  if (interp != (interpolator *)0x0) {
    sVar3 = peVar1->samples_in_100ms * 4;
    peVar1->resampler_buffer_input_frames = sVar3;
    uVar4 = st->channels;
    __ptr = (float *)malloc(peVar1->samples_in_100ms * (ulong)uVar4 * 0x10);
    peVar1->resampler_buffer_input = __ptr;
    if (__ptr == (float *)0x0) {
      interp_destroy(interp);
      peVar1 = st->d;
      peVar1->interp = (interpolator *)0x0;
      __ptr = peVar1->resampler_buffer_input;
    }
    else {
      sVar3 = sVar3 * interp->factor;
      peVar1->resampler_buffer_output_frames = sVar3;
      pfVar2 = (float *)malloc(uVar4 * sVar3 * 4);
      peVar1->resampler_buffer_output = pfVar2;
      if (pfVar2 != (float *)0x0) {
        return 0;
      }
    }
    free(__ptr);
    st->d->resampler_buffer_input = (float *)0x0;
  }
  return 1;
}

Assistant:

static int ebur128_init_resampler(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;

  if (st->samplerate < 96000) {
    st->d->interp = interp_create(49, 4, st->channels);
    CHECK_ERROR(!st->d->interp, EBUR128_ERROR_NOMEM, exit)
  } else if (st->samplerate < 192000) {
    st->d->interp = interp_create(49, 2, st->channels);
    CHECK_ERROR(!st->d->interp, EBUR128_ERROR_NOMEM, exit)
  } else {
    st->d->resampler_buffer_input = NULL;
    st->d->resampler_buffer_output = NULL;
    st->d->interp = NULL;
    goto exit;
  }

  st->d->resampler_buffer_input_frames = st->d->samples_in_100ms * 4;
  st->d->resampler_buffer_input = (float*) malloc(
      st->d->resampler_buffer_input_frames * st->channels * sizeof(float));
  CHECK_ERROR(!st->d->resampler_buffer_input, EBUR128_ERROR_NOMEM, free_interp)

  st->d->resampler_buffer_output_frames =
      st->d->resampler_buffer_input_frames * st->d->interp->factor;
  st->d->resampler_buffer_output = (float*) malloc(
      st->d->resampler_buffer_output_frames * st->channels * sizeof(float));
  CHECK_ERROR(!st->d->resampler_buffer_output, EBUR128_ERROR_NOMEM, free_input)

  return errcode;

free_interp:
  interp_destroy(st->d->interp);
  st->d->interp = NULL;
free_input:
  free(st->d->resampler_buffer_input);
  st->d->resampler_buffer_input = NULL;
exit:
  return errcode;
}